

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

void __thiscall Parser::memberDecl(Parser *this,ptr<ObjectExpression> *descriptor)

{
  bool bVar1;
  undefined8 extraout_RAX;
  Scope scope;
  initializer_list<TokenType> __l;
  allocator_type local_49;
  _Vector_base<TokenType,_std::allocator<TokenType>_> local_48;
  TokenType local_2c [3];
  
  bVar1 = match(this,Public);
  scope = Public;
  if (!bVar1) {
    bVar1 = match(this,Private);
    scope = Public;
    if (!bVar1) goto LAB_0010bf6a;
    scope = Private;
  }
  consume(this);
LAB_0010bf6a:
  local_2c[0] = Let;
  local_2c[1] = Const;
  local_2c[2] = 0x30;
  __l._M_len = 3;
  __l._M_array = local_2c;
  std::vector<TokenType,_std::allocator<TokenType>_>::vector
            ((vector<TokenType,_std::allocator<TokenType>_> *)&local_48,__l,&local_49);
  bVar1 = matchAny(this,(vector<TokenType,_std::allocator<TokenType>_> *)&local_48);
  std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base(&local_48);
  if (bVar1) {
    attributeDecl(this,descriptor,scope);
  }
  else {
    bVar1 = match(this,Function);
    if (!bVar1) {
      unexpected(this);
      std::_Vector_base<TokenType,_std::allocator<TokenType>_>::~_Vector_base(&local_48);
      _Unwind_Resume(extraout_RAX);
    }
    method(this,descriptor,scope);
  }
  return;
}

Assistant:

void Parser::memberDecl(ptr<ObjectExpression> &descriptor) {
    Scope scope = Scope::Public;

    if(match(TokenType::Public)) {
        consume();
    } else if(match(TokenType::Private)) {
        scope = Scope::Private;
        consume();
    }

    if(matchAny({ TokenType::Let, TokenType::Const, TokenType::Identifier }))
        attributeDecl(descriptor, scope);
    else if(match(TokenType::Function))
        method(descriptor, scope);
    else {
        unexpected();
    }
}